

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

RuntimeID __thiscall Jinx::Variant::GetFunction(Variant *this)

{
  bool bVar1;
  undefined1 local_40 [8];
  Variant v;
  Variant *this_local;
  
  v.field_1._24_8_ = this;
  bVar1 = IsFunction(this);
  if (bVar1) {
    this_local = (Variant *)
                 (this->field_1).m_collection.
                 super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  }
  else {
    Variant((Variant *)local_40,this);
    bVar1 = ConvertTo((Variant *)local_40,Function);
    if (bVar1) {
      this_local = (Variant *)GetFunction((Variant *)local_40);
    }
    else {
      this_local = (Variant *)0x0;
    }
    ~Variant((Variant *)local_40);
  }
  return (RuntimeID)this_local;
}

Assistant:

inline_t RuntimeID Variant::GetFunction() const
	{
		if (IsFunction())
			return m_function;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Function))
			return InvalidID;
		return v.GetFunction();
	}